

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O1

unsigned_long schedule_timer(int ticks,timer_fn_t fn,void *ctx)

{
  undefined8 *e;
  undefined8 *puVar1;
  unsigned_long uVar2;
  
  init_timers();
  now = getticks();
  uVar2 = (long)(int)(ticks + (uint)(ticks == 0)) + now;
  e = (undefined8 *)safemalloc(1,0x20,0);
  *e = fn;
  e[1] = ctx;
  e[2] = uVar2;
  e[3] = now;
  puVar1 = (undefined8 *)add234(timers,e);
  if (e == puVar1) {
    add234(timer_contexts,(void *)e[1]);
  }
  else {
    safefree(e);
  }
  puVar1 = (undefined8 *)index234(timers,0);
  if (puVar1 == e) {
    timer_change_notify(puVar1[2]);
  }
  return uVar2;
}

Assistant:

unsigned long schedule_timer(int ticks, timer_fn_t fn, void *ctx)
{
    unsigned long when;
    struct timer *t, *first;

    init_timers();

    now = GETTICKCOUNT();
    when = ticks + now;

    /*
     * Just in case our various defences against timing skew fail
     * us: if we try to schedule a timer that's already in the
     * past, we instead schedule it for the immediate future.
     */
    if (when - now <= 0)
        when = now + 1;

    t = snew(struct timer);
    t->fn = fn;
    t->ctx = ctx;
    t->now = when;
    t->when_set = now;

    if (t != add234(timers, t)) {
        sfree(t);                      /* identical timer already exists */
    } else {
        add234(timer_contexts, t->ctx);/* don't care if this fails */
    }

    first = (struct timer *)index234(timers, 0);
    if (first == t) {
        /*
         * This timer is the very first on the list, so we must
         * notify the front end.
         */
        timer_change_notify(first->now);
    }

    return when;
}